

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  undefined8 *puVar1;
  uint uVar2;
  int type;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  CURLcode CVar6;
  ulong uVar7;
  char *ptr;
  size_t len;
  ulong uVar8;
  dynbuf *s;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  undefined8 auStack_12a8 [571];
  undefined8 uStack_d0;
  connectdata *local_c0;
  uint local_b4;
  Curl_easy *local_b0;
  tempbuf writebuf [3];
  
  CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
  if (((data != (Curl_easy *)0x0) && (data->magic == 0xc0dedbad)) &&
     (data->conn != (connectdata *)0x0)) {
    uVar2 = (data->req).keepon;
    uVar10 = ((action & 1U) << 4 | uVar2 & 0xffffffcf) + (action & 4U) * 8;
    uVar9 = uVar10 & 0x30;
    if (uVar9 != (uVar2 & 0x30)) {
      if ((((uVar2 & ~uVar10 & 0x20) != 0) &&
          ((data->mstate & ~CURLM_STATE_CONNECT_PEND) == CURLM_STATE_PERFORM)) &&
         ((data->state).fread_func == Curl_mime_read)) {
        uStack_d0 = 0x114467;
        Curl_mime_unpause((curl_mimepart *)(data->state).in);
      }
      (data->req).keepon = uVar10;
      if (((action & 1U) == 0) && (uVar8 = (ulong)(data->state).tempcount, uVar8 != 0)) {
        local_c0 = data->conn;
        lVar11 = 0x1200;
        uVar7 = uVar8;
        for (uVar12 = 0; uVar12 < uVar7; uVar12 = uVar12 + 1) {
          *(undefined8 *)((long)auStack_12a8 + lVar11 + 0x20) =
               *(undefined8 *)((long)data->sockets + lVar11 + -0x60);
          puVar1 = (undefined8 *)((long)data->sockets + lVar11 + -0x80);
          uVar3 = *puVar1;
          uVar4 = puVar1[1];
          puVar1 = (undefined8 *)((long)data->sockets + lVar11 + -0x70);
          uVar5 = puVar1[1];
          *(undefined8 *)((long)auStack_12a8 + lVar11 + 0x10) = *puVar1;
          *(undefined8 *)((long)auStack_12a8 + lVar11 + 0x18) = uVar5;
          *(undefined8 *)((long)auStack_12a8 + lVar11) = uVar3;
          *(undefined8 *)((long)auStack_12a8 + lVar11 + 8) = uVar4;
          uStack_d0 = 0x1144da;
          Curl_dyn_init((dynbuf *)((long)data->sockets + lVar11 + -0x80),0x4000000);
          uVar7 = (ulong)(data->state).tempcount;
          lVar11 = lVar11 + 0x28;
        }
        (data->state).tempcount = 0;
        local_b0 = local_c0->data;
        CVar6 = CURLE_OK;
        if (local_b0 == data) {
          local_b0 = (Curl_easy *)0x0;
        }
        else {
          local_c0->data = data;
        }
        local_b4 = uVar9;
        for (lVar11 = 0; uVar8 * 0x28 - lVar11 != 0; lVar11 = lVar11 + 0x28) {
          s = (dynbuf *)((long)&writebuf[0].b.bufr + lVar11);
          if (CVar6 == CURLE_OK) {
            type = *(int *)((long)&writebuf[0].type + lVar11);
            uStack_d0 = 0x11453e;
            ptr = Curl_dyn_ptr(s);
            uStack_d0 = 0x114549;
            len = Curl_dyn_len(s);
            uStack_d0 = 0x11455b;
            CVar6 = Curl_client_write(local_c0,type,ptr,len);
          }
          uStack_d0 = 0x114566;
          Curl_dyn_free(s);
        }
        if (local_b0 != (Curl_easy *)0x0) {
          local_c0->data = local_b0;
        }
        uVar9 = local_b4;
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
      }
      if (uVar9 != 0x30) {
        uStack_d0 = 0x11459b;
        Curl_expire(data,0,EXPIRE_RUN_NOW);
        if ((data->state).tempcount == 0) {
          data->conn->cselect_bits = 3;
        }
        if (data->multi != (Curl_multi *)0x0) {
          uStack_d0 = 0x1145c3;
          Curl_update_timer(data->multi);
        }
      }
      if (((data->state).field_0x601 & 0x10) == 0) {
        uStack_d0 = 0x1145d4;
        Curl_updatesocket(data);
      }
    }
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k;
  CURLcode result = CURLE_OK;
  int oldstate;
  int newstate;

  if(!GOOD_EASY_HANDLE(data) || !data->conn)
    /* crazy input, don't continue */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  k = &data->req;
  oldstate = k->keepon & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* first switch off both pause bits then set the new pause bits */
  newstate = (k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) |
    ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  if((newstate & (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE)) == oldstate) {
    /* Not changing any pause state, return */
    DEBUGF(infof(data, "pause: no change, early return\n"));
    return CURLE_OK;
  }

  /* Unpause parts in active mime tree. */
  if((k->keepon & ~newstate & KEEP_SEND_PAUSE) &&
     (data->mstate == CURLM_STATE_PERFORM ||
      data->mstate == CURLM_STATE_TOOFAST) &&
     data->state.fread_func == (curl_read_callback) Curl_mime_read) {
    Curl_mime_unpause(data->state.in);
  }

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE)) {
    Curl_http2_stream_pause(data, FALSE);

    if(data->state.tempcount) {
      /* there are buffers for sending that can be delivered as the receive
         pausing is lifted! */
      unsigned int i;
      unsigned int count = data->state.tempcount;
      struct tempbuf writebuf[3]; /* there can only be three */
      struct connectdata *conn = data->conn;
      struct Curl_easy *saved_data = NULL;

      /* copy the structs to allow for immediate re-pausing */
      for(i = 0; i < data->state.tempcount; i++) {
        writebuf[i] = data->state.tempwrite[i];
        Curl_dyn_init(&data->state.tempwrite[i].b, DYN_PAUSE_BUFFER);
      }
      data->state.tempcount = 0;

      /* set the connection's current owner */
      if(conn->data != data) {
        saved_data = conn->data;
        conn->data = data;
      }

      for(i = 0; i < count; i++) {
        /* even if one function returns error, this loops through and frees
           all buffers */
        if(!result)
          result = Curl_client_write(conn, writebuf[i].type,
                                     Curl_dyn_ptr(&writebuf[i].b),
                                     Curl_dyn_len(&writebuf[i].b));
        Curl_dyn_free(&writebuf[i].b);
      }

      /* recover previous owner of the connection */
      if(saved_data)
        conn->data = saved_data;

      if(result)
        return result;
    }
  }

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if((newstate & (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
     (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) {
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

    if(!data->state.tempcount)
      /* if not pausing again, force a recv/send check of this connection as
         the data might've been read off the socket already */
      data->conn->cselect_bits = CURL_CSELECT_IN | CURL_CSELECT_OUT;
    if(data->multi)
      Curl_update_timer(data->multi);
  }

  if(!data->state.done)
    /* This transfer may have been moved in or out of the bundle, update the
       corresponding socket callback, if used */
    Curl_updatesocket(data);

  return result;
}